

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O2

Address __thiscall
wasm::ModuleRunnerBase<wasm::ModuleRunner>::getFinalAddress<wasm::SIMDLoad>
          (ModuleRunnerBase<wasm::ModuleRunner> *this,SIMDLoad *curr,Literal *ptr,Index bytes,
          Address memorySize)

{
  long lVar1;
  int32_t iVar2;
  uint64_t rhs;
  uint64_t lhs;
  
  if ((ptr->type).id == 2) {
    iVar2 = Literal::geti32(ptr);
    lhs = (uint64_t)iVar2;
  }
  else {
    lhs = Literal::geti64(ptr);
  }
  rhs = memorySize.addr * 0x10000;
  trapIfGt(this,*(uint64_t *)(curr + 0x18),rhs,"offset > memory");
  trapIfGt(this,lhs,rhs - *(long *)(curr + 0x18),"final > memory");
  lVar1 = *(long *)(curr + 0x18);
  trapIfGt(this,(ulong)bytes,rhs,"bytes > memory");
  checkLoadAddress(this,(Address)(lhs + lVar1),bytes,memorySize);
  return (Address)(lhs + lVar1);
}

Assistant:

Address
  getFinalAddress(LS* curr, Literal ptr, Index bytes, Address memorySize) {
    Address memorySizeBytes = memorySize * Memory::kPageSize;
    uint64_t addr = ptr.type == Type::i32 ? ptr.geti32() : ptr.geti64();
    trapIfGt(curr->offset, memorySizeBytes, "offset > memory");
    trapIfGt(addr, memorySizeBytes - curr->offset, "final > memory");
    addr += curr->offset;
    trapIfGt(bytes, memorySizeBytes, "bytes > memory");
    checkLoadAddress(addr, bytes, memorySize);
    return addr;
  }